

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

VariableP<deqp::gls::BuiltinPrecisionTests::Void> __thiscall
deqp::gls::BuiltinPrecisionTests::variable<deqp::gls::BuiltinPrecisionTests::Void>
          (BuiltinPrecisionTests *this,string *name)

{
  pointer pcVar1;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *ptr;
  SharedPtrStateBase *extraout_RDX;
  VariableP<deqp::gls::BuiltinPrecisionTests::Void> VVar2;
  
  ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)operator_new(0x28);
  (ptr->super_Expr<deqp::gls::BuiltinPrecisionTests::Void>).super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__Variable_00d41e10;
  (ptr->m_name)._M_dataplus._M_p = (pointer)&(ptr->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ptr->m_name,pcVar1,pcVar1 + name->_M_string_length);
  VariableP<deqp::gls::BuiltinPrecisionTests::Void>::VariableP
            ((VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)this,ptr);
  VVar2.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_state = extraout_RDX;
  VVar2.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)this;
  return (VariableP<deqp::gls::BuiltinPrecisionTests::Void>)
         VVar2.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ;
}

Assistant:

VariableP<T> variable (const string& name)
{
	return VariableP<T>(new Variable<T>(name));
}